

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

void capnp::_::anon_unknown_134::dynamicInitListDefaults(Builder builder)

{
  initializer_list<capnp::DynamicValue::Reader> value;
  initializer_list<capnp::DynamicValue::Reader> value_00;
  initializer_list<capnp::DynamicValue::Reader> value_01;
  initializer_list<capnp::DynamicValue::Reader> value_02;
  initializer_list<capnp::DynamicValue::Reader> value_03;
  initializer_list<capnp::DynamicValue::Reader> value_04;
  Reader *local_23b8;
  Reader *local_2398;
  Reader *local_2378;
  Reader *local_2350;
  Reader *local_2330;
  Reader *local_2310;
  Builder local_2218;
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> local_21d8;
  Builder local_21b0;
  undefined1 local_2170 [56];
  Builder local_2138;
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> local_20f8;
  Builder local_20d0;
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> local_2090;
  Builder local_2068;
  undefined1 auStack_2028 [8];
  BuilderFor<capnp::DynamicList> e;
  StringPtr local_1fe8;
  Builder local_1fd8;
  undefined1 local_1f98 [8];
  BuilderFor<capnp::DynamicList> l_2;
  Reader local_1f58;
  Reader local_1f10;
  iterator local_1ec8;
  undefined1 local_1ec0 [72];
  BuilderFor<capnp::DynamicList> local_1e78;
  Reader *local_1e40;
  Reader local_1e38;
  iterator local_1df0;
  undefined1 local_1de8 [72];
  BuilderFor<capnp::DynamicList> local_1da0;
  Reader *local_1d68;
  Reader local_1d60;
  Reader local_1d18;
  iterator local_1cd0;
  undefined1 local_1cc8 [72];
  BuilderFor<capnp::DynamicList> local_1c80;
  StringPtr local_1c48;
  Builder local_1c38;
  undefined1 local_1bf8 [8];
  BuilderFor<capnp::DynamicList> l_1;
  Reader local_1bb8;
  iterator local_1b70;
  undefined1 local_1b68 [72];
  BuilderFor<capnp::DynamicList> local_1b20;
  Reader *local_1ae8;
  Reader local_1ae0;
  Reader local_1a98;
  iterator local_1a50;
  undefined1 local_1a48 [72];
  BuilderFor<capnp::DynamicList> local_1a00;
  Reader *local_19c8;
  Reader local_19c0;
  Reader local_1978;
  Reader local_1930;
  iterator local_18e8;
  undefined1 local_18e0 [72];
  BuilderFor<capnp::DynamicList> local_1898;
  StringPtr local_1860;
  Builder local_1850;
  undefined1 local_1810 [8];
  BuilderFor<capnp::DynamicList> l;
  ArrayPtr<const_char> local_1790;
  ArrayPtr<const_char> local_1780;
  Builder local_1770;
  BuilderFor<capnp::DynamicList> local_1730;
  Builder local_16f8;
  BuilderFor<capnp::DynamicStruct> local_16b8;
  Reader local_1688;
  ArrayPtr<const_char> local_1640;
  ArrayPtr<const_char> local_1630;
  Builder local_1620;
  BuilderFor<capnp::DynamicList> local_15e0;
  Builder local_15a8;
  BuilderFor<capnp::DynamicStruct> local_1568;
  Reader local_1538;
  ArrayPtr<const_char> local_14f0;
  ArrayPtr<const_char> local_14e0;
  Builder local_14d0;
  BuilderFor<capnp::DynamicList> local_1490;
  Builder local_1458;
  BuilderFor<capnp::DynamicStruct> local_1418;
  Reader local_13e8;
  ArrayPtr<const_char> local_13a0;
  ArrayPtr<const_char> local_1390;
  Builder local_1380;
  BuilderFor<capnp::DynamicList> local_1340;
  Builder local_1308;
  BuilderFor<capnp::DynamicStruct> local_12c8;
  Reader local_1298;
  ArrayPtr<const_char> local_1250;
  ArrayPtr<const_char> local_1240;
  Builder local_1230;
  BuilderFor<capnp::DynamicList> local_11f0;
  Builder local_11b8;
  BuilderFor<capnp::DynamicStruct> local_1178;
  Reader local_1148;
  ArrayPtr<const_char> local_1100;
  ArrayPtr<const_char> local_10f0;
  Builder local_10e0;
  BuilderFor<capnp::DynamicList> local_10a0;
  Builder local_1068;
  BuilderFor<capnp::DynamicStruct> local_1028;
  Reader local_ff8;
  ArrayPtr<const_char> local_fb0;
  ArrayPtr<const_char> local_fa0;
  Builder local_f90;
  BuilderFor<capnp::DynamicList> local_f50;
  Builder local_f18;
  BuilderFor<capnp::DynamicStruct> local_ed8;
  Reader local_ea8;
  ArrayPtr<const_char> local_e60;
  ArrayPtr<const_char> local_e50;
  Builder local_e40;
  BuilderFor<capnp::DynamicList> local_e00;
  Builder local_dc8;
  BuilderFor<capnp::DynamicStruct> local_d88;
  Reader local_d58;
  ArrayPtr<const_char> local_d10;
  ArrayPtr<const_char> local_d00;
  Builder local_cf0;
  BuilderFor<capnp::DynamicList> local_cb0;
  Builder local_c78;
  BuilderFor<capnp::DynamicStruct> local_c38;
  Reader local_c08;
  ArrayPtr<const_char> local_bc0;
  ArrayPtr<const_char> local_bb0;
  Builder local_ba0;
  BuilderFor<capnp::DynamicList> local_b60;
  Builder local_b28;
  BuilderFor<capnp::DynamicStruct> local_ae8;
  Reader local_ab8;
  ArrayPtr<const_char> local_a70;
  ArrayPtr<const_char> local_a60;
  Builder local_a50;
  BuilderFor<capnp::DynamicList> local_a10;
  Builder local_9d8;
  BuilderFor<capnp::DynamicStruct> local_998;
  Reader local_968;
  ArrayPtr<const_char> local_920;
  ArrayPtr<const_char> local_910;
  Builder local_900;
  BuilderFor<capnp::DynamicList> local_8c0;
  Builder local_888;
  BuilderFor<capnp::DynamicStruct> local_848;
  Reader local_818;
  ArrayPtr<const_char> local_7d0;
  ArrayPtr<const_char> local_7c0;
  Builder local_7b0;
  BuilderFor<capnp::DynamicList> local_770;
  Builder local_738;
  BuilderFor<capnp::DynamicStruct> local_6f8;
  Reader local_6c8;
  ArrayPtr<const_char> local_680;
  ArrayPtr<const_char> local_670;
  Builder local_660;
  BuilderFor<capnp::DynamicList> local_620;
  Builder local_5e8;
  BuilderFor<capnp::DynamicStruct> local_5a8;
  Reader local_570;
  ArrayPtr<const_char> local_528;
  ArrayPtr<const_char> local_518;
  Builder local_508;
  BuilderFor<capnp::DynamicList> local_4c8;
  Builder local_490;
  BuilderFor<capnp::DynamicStruct> local_450;
  Reader local_418;
  ArrayPtr<const_char> local_3d0;
  ArrayPtr<const_char> local_3c0;
  Builder local_3b0;
  BuilderFor<capnp::DynamicList> local_370;
  Builder local_338;
  BuilderFor<capnp::DynamicStruct> local_2f8;
  StringPtr local_2c8;
  Builder local_2b8;
  StringPtr local_278;
  Builder local_268;
  StringPtr local_228;
  Builder local_218;
  StringPtr local_1d8;
  Builder local_1c8;
  StringPtr local_188;
  Builder local_178;
  StringPtr local_138;
  Builder local_128;
  StringPtr local_e8;
  Builder local_d8;
  StringPtr local_88;
  Builder local_78;
  undefined1 local_38 [8];
  BuilderFor<capnp::DynamicStruct> lists;
  
  kj::StringPtr::StringPtr(&local_88,"lists");
  DynamicStruct::Builder::init((Builder *)&local_78,(EVP_PKEY_CTX *)&stack0x00000008);
  DynamicValue::Builder::as<capnp::DynamicStruct>
            ((BuilderFor<capnp::DynamicStruct> *)local_38,&local_78);
  DynamicValue::Builder::~Builder(&local_78);
  kj::StringPtr::StringPtr(&local_e8,"list0");
  DynamicStruct::Builder::init((Builder *)&local_d8,(EVP_PKEY_CTX *)local_38);
  DynamicValue::Builder::~Builder(&local_d8);
  kj::StringPtr::StringPtr(&local_138,"list1");
  DynamicStruct::Builder::init((Builder *)&local_128,(EVP_PKEY_CTX *)local_38);
  DynamicValue::Builder::~Builder(&local_128);
  kj::StringPtr::StringPtr(&local_188,"list8");
  DynamicStruct::Builder::init((Builder *)&local_178,(EVP_PKEY_CTX *)local_38);
  DynamicValue::Builder::~Builder(&local_178);
  kj::StringPtr::StringPtr(&local_1d8,"list16");
  DynamicStruct::Builder::init((Builder *)&local_1c8,(EVP_PKEY_CTX *)local_38);
  DynamicValue::Builder::~Builder(&local_1c8);
  kj::StringPtr::StringPtr(&local_228,"list32");
  DynamicStruct::Builder::init((Builder *)&local_218,(EVP_PKEY_CTX *)local_38);
  DynamicValue::Builder::~Builder(&local_218);
  kj::StringPtr::StringPtr(&local_278,"list64");
  DynamicStruct::Builder::init((Builder *)&local_268,(EVP_PKEY_CTX *)local_38);
  DynamicValue::Builder::~Builder(&local_268);
  kj::StringPtr::StringPtr(&local_2c8,"listP");
  DynamicStruct::Builder::init((Builder *)&local_2b8,(EVP_PKEY_CTX *)local_38);
  DynamicValue::Builder::~Builder(&local_2b8);
  kj::StringPtr::StringPtr((StringPtr *)&local_3c0,"list0");
  DynamicStruct::Builder::get(&local_3b0,(Builder *)local_38,(StringPtr)local_3c0);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_370,&local_3b0);
  DynamicList::Builder::operator[](&local_338,&local_370,0);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_2f8,&local_338);
  kj::StringPtr::StringPtr((StringPtr *)&local_3d0,"f");
  DynamicValue::Reader::Reader(&local_418);
  DynamicStruct::Builder::set(&local_2f8,(StringPtr)local_3d0,&local_418);
  DynamicValue::Reader::~Reader(&local_418);
  DynamicValue::Builder::~Builder(&local_338);
  DynamicValue::Builder::~Builder(&local_3b0);
  kj::StringPtr::StringPtr((StringPtr *)&local_518,"list0");
  DynamicStruct::Builder::get(&local_508,(Builder *)local_38,(StringPtr)local_518);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_4c8,&local_508);
  DynamicList::Builder::operator[](&local_490,&local_4c8,1);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_450,&local_490);
  kj::StringPtr::StringPtr((StringPtr *)&local_528,"f");
  DynamicValue::Reader::Reader(&local_570);
  DynamicStruct::Builder::set(&local_450,(StringPtr)local_528,&local_570);
  DynamicValue::Reader::~Reader(&local_570);
  DynamicValue::Builder::~Builder(&local_490);
  DynamicValue::Builder::~Builder(&local_508);
  kj::StringPtr::StringPtr((StringPtr *)&local_670,"list1");
  DynamicStruct::Builder::get(&local_660,(Builder *)local_38,(StringPtr)local_670);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_620,&local_660);
  DynamicList::Builder::operator[](&local_5e8,&local_620,0);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_5a8,&local_5e8);
  kj::StringPtr::StringPtr((StringPtr *)&local_680,"f");
  DynamicValue::Reader::Reader(&local_6c8,true);
  DynamicStruct::Builder::set(&local_5a8,(StringPtr)local_680,&local_6c8);
  DynamicValue::Reader::~Reader(&local_6c8);
  DynamicValue::Builder::~Builder(&local_5e8);
  DynamicValue::Builder::~Builder(&local_660);
  kj::StringPtr::StringPtr((StringPtr *)&local_7c0,"list1");
  DynamicStruct::Builder::get(&local_7b0,(Builder *)local_38,(StringPtr)local_7c0);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_770,&local_7b0);
  DynamicList::Builder::operator[](&local_738,&local_770,1);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_6f8,&local_738);
  kj::StringPtr::StringPtr((StringPtr *)&local_7d0,"f");
  DynamicValue::Reader::Reader(&local_818,false);
  DynamicStruct::Builder::set(&local_6f8,(StringPtr)local_7d0,&local_818);
  DynamicValue::Reader::~Reader(&local_818);
  DynamicValue::Builder::~Builder(&local_738);
  DynamicValue::Builder::~Builder(&local_7b0);
  kj::StringPtr::StringPtr((StringPtr *)&local_910,"list1");
  DynamicStruct::Builder::get(&local_900,(Builder *)local_38,(StringPtr)local_910);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_8c0,&local_900);
  DynamicList::Builder::operator[](&local_888,&local_8c0,2);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_848,&local_888);
  kj::StringPtr::StringPtr((StringPtr *)&local_920,"f");
  DynamicValue::Reader::Reader(&local_968,true);
  DynamicStruct::Builder::set(&local_848,(StringPtr)local_920,&local_968);
  DynamicValue::Reader::~Reader(&local_968);
  DynamicValue::Builder::~Builder(&local_888);
  DynamicValue::Builder::~Builder(&local_900);
  kj::StringPtr::StringPtr((StringPtr *)&local_a60,"list1");
  DynamicStruct::Builder::get(&local_a50,(Builder *)local_38,(StringPtr)local_a60);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_a10,&local_a50);
  DynamicList::Builder::operator[](&local_9d8,&local_a10,3);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_998,&local_9d8);
  kj::StringPtr::StringPtr((StringPtr *)&local_a70,"f");
  DynamicValue::Reader::Reader(&local_ab8,true);
  DynamicStruct::Builder::set(&local_998,(StringPtr)local_a70,&local_ab8);
  DynamicValue::Reader::~Reader(&local_ab8);
  DynamicValue::Builder::~Builder(&local_9d8);
  DynamicValue::Builder::~Builder(&local_a50);
  kj::StringPtr::StringPtr((StringPtr *)&local_bb0,"list8");
  DynamicStruct::Builder::get(&local_ba0,(Builder *)local_38,(StringPtr)local_bb0);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_b60,&local_ba0);
  DynamicList::Builder::operator[](&local_b28,&local_b60,0);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_ae8,&local_b28);
  kj::StringPtr::StringPtr((StringPtr *)&local_bc0,"f");
  DynamicValue::Reader::Reader(&local_c08,0x7b);
  DynamicStruct::Builder::set(&local_ae8,(StringPtr)local_bc0,&local_c08);
  DynamicValue::Reader::~Reader(&local_c08);
  DynamicValue::Builder::~Builder(&local_b28);
  DynamicValue::Builder::~Builder(&local_ba0);
  kj::StringPtr::StringPtr((StringPtr *)&local_d00,"list8");
  DynamicStruct::Builder::get(&local_cf0,(Builder *)local_38,(StringPtr)local_d00);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_cb0,&local_cf0);
  DynamicList::Builder::operator[](&local_c78,&local_cb0,1);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_c38,&local_c78);
  kj::StringPtr::StringPtr((StringPtr *)&local_d10,"f");
  DynamicValue::Reader::Reader(&local_d58,0x2d);
  DynamicStruct::Builder::set(&local_c38,(StringPtr)local_d10,&local_d58);
  DynamicValue::Reader::~Reader(&local_d58);
  DynamicValue::Builder::~Builder(&local_c78);
  DynamicValue::Builder::~Builder(&local_cf0);
  kj::StringPtr::StringPtr((StringPtr *)&local_e50,"list16");
  DynamicStruct::Builder::get(&local_e40,(Builder *)local_38,(StringPtr)local_e50);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_e00,&local_e40);
  DynamicList::Builder::operator[](&local_dc8,&local_e00,0);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_d88,&local_dc8);
  kj::StringPtr::StringPtr((StringPtr *)&local_e60,"f");
  DynamicValue::Reader::Reader(&local_ea8,0x3039);
  DynamicStruct::Builder::set(&local_d88,(StringPtr)local_e60,&local_ea8);
  DynamicValue::Reader::~Reader(&local_ea8);
  DynamicValue::Builder::~Builder(&local_dc8);
  DynamicValue::Builder::~Builder(&local_e40);
  kj::StringPtr::StringPtr((StringPtr *)&local_fa0,"list16");
  DynamicStruct::Builder::get(&local_f90,(Builder *)local_38,(StringPtr)local_fa0);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_f50,&local_f90);
  DynamicList::Builder::operator[](&local_f18,&local_f50,1);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_ed8,&local_f18);
  kj::StringPtr::StringPtr((StringPtr *)&local_fb0,"f");
  DynamicValue::Reader::Reader(&local_ff8,0x1a85);
  DynamicStruct::Builder::set(&local_ed8,(StringPtr)local_fb0,&local_ff8);
  DynamicValue::Reader::~Reader(&local_ff8);
  DynamicValue::Builder::~Builder(&local_f18);
  DynamicValue::Builder::~Builder(&local_f90);
  kj::StringPtr::StringPtr((StringPtr *)&local_10f0,"list32");
  DynamicStruct::Builder::get(&local_10e0,(Builder *)local_38,(StringPtr)local_10f0);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_10a0,&local_10e0);
  DynamicList::Builder::operator[](&local_1068,&local_10a0,0);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_1028,&local_1068);
  kj::StringPtr::StringPtr((StringPtr *)&local_1100,"f");
  DynamicValue::Reader::Reader(&local_1148,0x75bcd15);
  DynamicStruct::Builder::set(&local_1028,(StringPtr)local_1100,&local_1148);
  DynamicValue::Reader::~Reader(&local_1148);
  DynamicValue::Builder::~Builder(&local_1068);
  DynamicValue::Builder::~Builder(&local_10e0);
  kj::StringPtr::StringPtr((StringPtr *)&local_1240,"list32");
  DynamicStruct::Builder::get(&local_1230,(Builder *)local_38,(StringPtr)local_1240);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_11f0,&local_1230);
  DynamicList::Builder::operator[](&local_11b8,&local_11f0,1);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_1178,&local_11b8);
  kj::StringPtr::StringPtr((StringPtr *)&local_1250,"f");
  DynamicValue::Reader::Reader(&local_1298,0xdfb38d2);
  DynamicStruct::Builder::set(&local_1178,(StringPtr)local_1250,&local_1298);
  DynamicValue::Reader::~Reader(&local_1298);
  DynamicValue::Builder::~Builder(&local_11b8);
  DynamicValue::Builder::~Builder(&local_1230);
  kj::StringPtr::StringPtr((StringPtr *)&local_1390,"list64");
  DynamicStruct::Builder::get(&local_1380,(Builder *)local_38,(StringPtr)local_1390);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_1340,&local_1380);
  DynamicList::Builder::operator[](&local_1308,&local_1340,0);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_12c8,&local_1308);
  kj::StringPtr::StringPtr((StringPtr *)&local_13a0,"f");
  DynamicValue::Reader::Reader(&local_13e8,0x462d53c8abac0);
  DynamicStruct::Builder::set(&local_12c8,(StringPtr)local_13a0,&local_13e8);
  DynamicValue::Reader::~Reader(&local_13e8);
  DynamicValue::Builder::~Builder(&local_1308);
  DynamicValue::Builder::~Builder(&local_1380);
  kj::StringPtr::StringPtr((StringPtr *)&local_14e0,"list64");
  DynamicStruct::Builder::get(&local_14d0,(Builder *)local_38,(StringPtr)local_14e0);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_1490,&local_14d0);
  DynamicList::Builder::operator[](&local_1458,&local_1490,1);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_1418,&local_1458);
  kj::StringPtr::StringPtr((StringPtr *)&local_14f0,"f");
  DynamicValue::Reader::Reader(&local_1538,0x85561edaa4b87);
  DynamicStruct::Builder::set(&local_1418,(StringPtr)local_14f0,&local_1538);
  DynamicValue::Reader::~Reader(&local_1538);
  DynamicValue::Builder::~Builder(&local_1458);
  DynamicValue::Builder::~Builder(&local_14d0);
  kj::StringPtr::StringPtr((StringPtr *)&local_1630,"listP");
  DynamicStruct::Builder::get(&local_1620,(Builder *)local_38,(StringPtr)local_1630);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_15e0,&local_1620);
  DynamicList::Builder::operator[](&local_15a8,&local_15e0,0);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_1568,&local_15a8);
  kj::StringPtr::StringPtr((StringPtr *)&local_1640,"f");
  DynamicValue::Reader::Reader(&local_1688,"foo");
  DynamicStruct::Builder::set(&local_1568,(StringPtr)local_1640,&local_1688);
  DynamicValue::Reader::~Reader(&local_1688);
  DynamicValue::Builder::~Builder(&local_15a8);
  DynamicValue::Builder::~Builder(&local_1620);
  kj::StringPtr::StringPtr((StringPtr *)&local_1780,"listP");
  DynamicStruct::Builder::get(&local_1770,(Builder *)local_38,(StringPtr)local_1780);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_1730,&local_1770);
  DynamicList::Builder::operator[](&local_16f8,&local_1730,1);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_16b8,&local_16f8);
  kj::StringPtr::StringPtr((StringPtr *)&local_1790,"f");
  DynamicValue::Reader::Reader((Reader *)&l.builder.structDataSize,"bar");
  DynamicStruct::Builder::set(&local_16b8,(StringPtr)local_1790,(Reader *)&l.builder.structDataSize)
  ;
  DynamicValue::Reader::~Reader((Reader *)&l.builder.structDataSize);
  DynamicValue::Builder::~Builder(&local_16f8);
  DynamicValue::Builder::~Builder(&local_1770);
  kj::StringPtr::StringPtr(&local_1860,"int32ListList");
  DynamicStruct::Builder::init((Builder *)&local_1850,(EVP_PKEY_CTX *)local_38);
  DynamicValue::Builder::as<capnp::DynamicList>
            ((BuilderFor<capnp::DynamicList> *)local_1810,&local_1850);
  DynamicValue::Builder::~Builder(&local_1850);
  DynamicList::Builder::init((Builder *)(local_18e0 + 8),(EVP_PKEY_CTX *)local_1810);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_1898,(Builder *)(local_18e0 + 8));
  local_19c8 = &local_19c0;
  DynamicValue::Reader::Reader(local_19c8,1);
  local_19c8 = &local_1978;
  DynamicValue::Reader::Reader(local_19c8,2);
  local_19c8 = &local_1930;
  DynamicValue::Reader::Reader(local_19c8,3);
  local_18e8 = &local_19c0;
  local_18e0._0_8_ = 3;
  value_04._M_len = 3;
  value_04._M_array = local_18e8;
  DynamicList::Builder::copyFrom(&local_1898,value_04);
  local_2310 = (Reader *)&local_18e8;
  do {
    local_2310 = local_2310 + -1;
    DynamicValue::Reader::~Reader(local_2310);
  } while (local_2310 != &local_19c0);
  DynamicValue::Builder::~Builder((Builder *)(local_18e0 + 8));
  DynamicList::Builder::init((Builder *)(local_1a48 + 8),(EVP_PKEY_CTX *)local_1810);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_1a00,(Builder *)(local_1a48 + 8));
  local_1ae8 = &local_1ae0;
  DynamicValue::Reader::Reader(local_1ae8,4);
  local_1ae8 = &local_1a98;
  DynamicValue::Reader::Reader(local_1ae8,5);
  local_1a50 = &local_1ae0;
  local_1a48._0_8_ = 2;
  value_03._M_len = 2;
  value_03._M_array = local_1a50;
  DynamicList::Builder::copyFrom(&local_1a00,value_03);
  local_2330 = (Reader *)&local_1a50;
  do {
    local_2330 = local_2330 + -1;
    DynamicValue::Reader::~Reader(local_2330);
  } while (local_2330 != &local_1ae0);
  DynamicValue::Builder::~Builder((Builder *)(local_1a48 + 8));
  DynamicList::Builder::init((Builder *)(local_1b68 + 8),(EVP_PKEY_CTX *)local_1810);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_1b20,(Builder *)(local_1b68 + 8));
  l_1.builder._32_8_ = &local_1bb8;
  DynamicValue::Reader::Reader((Reader *)l_1.builder._32_8_,0xbc4ff2);
  local_1b70 = &local_1bb8;
  local_1b68._0_8_ = 1;
  value_02._M_len = 1;
  value_02._M_array = local_1b70;
  DynamicList::Builder::copyFrom(&local_1b20,value_02);
  local_2350 = (Reader *)&local_1b70;
  do {
    local_2350 = local_2350 + -1;
    DynamicValue::Reader::~Reader(local_2350);
  } while (local_2350 != &local_1bb8);
  DynamicValue::Builder::~Builder((Builder *)(local_1b68 + 8));
  kj::StringPtr::StringPtr(&local_1c48,"textListList");
  DynamicStruct::Builder::init((Builder *)&local_1c38,(EVP_PKEY_CTX *)local_38);
  DynamicValue::Builder::as<capnp::DynamicList>
            ((BuilderFor<capnp::DynamicList> *)local_1bf8,&local_1c38);
  DynamicValue::Builder::~Builder(&local_1c38);
  DynamicList::Builder::init((Builder *)(local_1cc8 + 8),(EVP_PKEY_CTX *)local_1bf8);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_1c80,(Builder *)(local_1cc8 + 8));
  local_1d68 = &local_1d60;
  DynamicValue::Reader::Reader(local_1d68,"foo");
  local_1d68 = &local_1d18;
  DynamicValue::Reader::Reader(local_1d68,"bar");
  local_1cd0 = &local_1d60;
  local_1cc8._0_8_ = 2;
  value_01._M_len = 2;
  value_01._M_array = local_1cd0;
  DynamicList::Builder::copyFrom(&local_1c80,value_01);
  local_2378 = (Reader *)&local_1cd0;
  do {
    local_2378 = local_2378 + -1;
    DynamicValue::Reader::~Reader(local_2378);
  } while (local_2378 != &local_1d60);
  DynamicValue::Builder::~Builder((Builder *)(local_1cc8 + 8));
  DynamicList::Builder::init((Builder *)(local_1de8 + 8),(EVP_PKEY_CTX *)local_1bf8);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_1da0,(Builder *)(local_1de8 + 8));
  local_1e40 = &local_1e38;
  DynamicValue::Reader::Reader(local_1e40,"baz");
  local_1df0 = &local_1e38;
  local_1de8._0_8_ = 1;
  value_00._M_len = 1;
  value_00._M_array = local_1df0;
  DynamicList::Builder::copyFrom(&local_1da0,value_00);
  local_2398 = (Reader *)&local_1df0;
  do {
    local_2398 = local_2398 + -1;
    DynamicValue::Reader::~Reader(local_2398);
  } while (local_2398 != &local_1e38);
  DynamicValue::Builder::~Builder((Builder *)(local_1de8 + 8));
  DynamicList::Builder::init((Builder *)(local_1ec0 + 8),(EVP_PKEY_CTX *)local_1bf8);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_1e78,(Builder *)(local_1ec0 + 8));
  l_2.builder._32_8_ = &local_1f58;
  DynamicValue::Reader::Reader((Reader *)l_2.builder._32_8_,"qux");
  l_2.builder._32_8_ = &local_1f10;
  DynamicValue::Reader::Reader((Reader *)l_2.builder._32_8_,"corge");
  local_1ec8 = &local_1f58;
  local_1ec0._0_8_ = 2;
  value._M_len = 2;
  value._M_array = local_1ec8;
  DynamicList::Builder::copyFrom(&local_1e78,value);
  local_23b8 = (Reader *)&local_1ec8;
  do {
    local_23b8 = local_23b8 + -1;
    DynamicValue::Reader::~Reader(local_23b8);
  } while (local_23b8 != &local_1f58);
  DynamicValue::Builder::~Builder((Builder *)(local_1ec0 + 8));
  kj::StringPtr::StringPtr(&local_1fe8,"structListList");
  DynamicStruct::Builder::init((Builder *)&local_1fd8,(EVP_PKEY_CTX *)local_38);
  DynamicValue::Builder::as<capnp::DynamicList>
            ((BuilderFor<capnp::DynamicList> *)local_1f98,&local_1fd8);
  DynamicValue::Builder::~Builder(&local_1fd8);
  DynamicList::Builder::init((Builder *)&local_2068,(EVP_PKEY_CTX *)local_1f98);
  DynamicValue::Builder::as<capnp::DynamicList>
            ((BuilderFor<capnp::DynamicList> *)auStack_2028,&local_2068);
  DynamicValue::Builder::~Builder(&local_2068);
  DynamicList::Builder::operator[](&local_20d0,(Builder *)auStack_2028,0);
  DynamicValue::Builder::as<capnproto_test::capnp::test::TestAllTypes>(&local_2090,&local_20d0);
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt32Field(&local_2090,0x7b);
  DynamicValue::Builder::~Builder(&local_20d0);
  DynamicList::Builder::operator[](&local_2138,(Builder *)auStack_2028,1);
  DynamicValue::Builder::as<capnproto_test::capnp::test::TestAllTypes>(&local_20f8,&local_2138);
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt32Field(&local_20f8,0x1c8);
  DynamicValue::Builder::~Builder(&local_2138);
  DynamicList::Builder::init((Builder *)&local_21b0,(EVP_PKEY_CTX *)local_1f98);
  DynamicValue::Builder::as<capnp::DynamicList>
            ((BuilderFor<capnp::DynamicList> *)local_2170,&local_21b0);
  e.builder.elementCount = local_2170._48_4_;
  e.builder.step = local_2170._52_4_;
  e.builder.capTable = (CapTableBuilder *)local_2170._32_8_;
  e.builder.ptr = (byte *)local_2170._40_8_;
  e.schema.elementType.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)local_2170._16_8_;
  e.builder.segment = (SegmentBuilder *)local_2170._24_8_;
  auStack_2028 = (undefined1  [8])local_2170._0_8_;
  e.schema.elementType.baseType = local_2170._8_2_;
  e.schema.elementType.listDepth = local_2170[10];
  e.schema.elementType.isImplicitParam = (bool)local_2170[0xb];
  e.schema.elementType.field_3 = (anon_union_2_2_d12d5221_for_Type_3)local_2170._12_2_;
  e.schema.elementType._6_2_ = local_2170._14_2_;
  DynamicValue::Builder::~Builder(&local_21b0);
  DynamicList::Builder::operator[](&local_2218,(Builder *)auStack_2028,0);
  DynamicValue::Builder::as<capnproto_test::capnp::test::TestAllTypes>(&local_21d8,&local_2218);
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt32Field(&local_21d8,0x315);
  DynamicValue::Builder::~Builder(&local_2218);
  return;
}

Assistant:

void dynamicInitListDefaults(DynamicStruct::Builder builder) {
  auto lists = builder.init("lists").as<DynamicStruct>();

  lists.init("list0", 2);
  lists.init("list1", 4);
  lists.init("list8", 2);
  lists.init("list16", 2);
  lists.init("list32", 2);
  lists.init("list64", 2);
  lists.init("listP", 2);

  lists.get("list0").as<DynamicList>()[0].as<DynamicStruct>().set("f", VOID);
  lists.get("list0").as<DynamicList>()[1].as<DynamicStruct>().set("f", VOID);
  lists.get("list1").as<DynamicList>()[0].as<DynamicStruct>().set("f", true);
  lists.get("list1").as<DynamicList>()[1].as<DynamicStruct>().set("f", false);
  lists.get("list1").as<DynamicList>()[2].as<DynamicStruct>().set("f", true);
  lists.get("list1").as<DynamicList>()[3].as<DynamicStruct>().set("f", true);
  lists.get("list8").as<DynamicList>()[0].as<DynamicStruct>().set("f", 123u);
  lists.get("list8").as<DynamicList>()[1].as<DynamicStruct>().set("f", 45u);
  lists.get("list16").as<DynamicList>()[0].as<DynamicStruct>().set("f", 12345u);
  lists.get("list16").as<DynamicList>()[1].as<DynamicStruct>().set("f", 6789u);
  lists.get("list32").as<DynamicList>()[0].as<DynamicStruct>().set("f", 123456789u);
  lists.get("list32").as<DynamicList>()[1].as<DynamicStruct>().set("f", 234567890u);
  lists.get("list64").as<DynamicList>()[0].as<DynamicStruct>().set("f", 1234567890123456u);
  lists.get("list64").as<DynamicList>()[1].as<DynamicStruct>().set("f", 2345678901234567u);
  lists.get("listP").as<DynamicList>()[0].as<DynamicStruct>().set("f", "foo");
  lists.get("listP").as<DynamicList>()[1].as<DynamicStruct>().set("f", "bar");

  {
    auto l = lists.init("int32ListList", 3).as<DynamicList>();
    l.init(0, 3).as<DynamicList>().copyFrom({1, 2, 3});
    l.init(1, 2).as<DynamicList>().copyFrom({4, 5});
    l.init(2, 1).as<DynamicList>().copyFrom({12341234});
  }

  {
    auto l = lists.init("textListList", 3).as<DynamicList>();
    l.init(0, 2).as<DynamicList>().copyFrom({"foo", "bar"});
    l.init(1, 1).as<DynamicList>().copyFrom({"baz"});
    l.init(2, 2).as<DynamicList>().copyFrom({"qux", "corge"});
  }

  {
    auto l = lists.init("structListList", 2).as<DynamicList>();
    auto e = l.init(0, 2).as<DynamicList>();
    e[0].as<TestAllTypes>().setInt32Field(123);
    e[1].as<TestAllTypes>().setInt32Field(456);
    e = l.init(1, 1).as<DynamicList>();
    e[0].as<TestAllTypes>().setInt32Field(789);
  }
}